

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::String(String *this,void *blk,int len)

{
  uchar *__dest;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < len) {
    (this->super_tagbstring).mlen = len + 1U;
    (this->super_tagbstring).slen = len;
    __dest = (uchar *)malloc((ulong)(len + 1U));
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      if (blk != (void *)0x0 && len != 0) {
        memcpy(__dest,blk,(ulong)(uint)len);
      }
      __dest[(uint)len] = '\0';
      return;
    }
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
          "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
          ,0x3a,"Failure in block constructor");
  return;
}

Assistant:

String::String(const void * blk, int len)
    {
        slen = mlen = 0; data = 0;
        if (len >= 0)
        {
            mlen = len + 1;
            slen = len;
            data = (uint8 * ) malloc(mlen);
        }
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in block constructor");
        }
        else
        {
            if (slen > 0 && blk)    memcpy(data, blk, slen);
            data[slen] = '\0';
        }
    }